

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_buffer.hpp
# Opt level: O2

string_t __thiscall duckdb::VectorStringBuffer::AddBlob(VectorStringBuffer *this,string_t data)

{
  char *data_00;
  anon_union_16_2_67f50693_for_value aVar1;
  undefined8 local_10;
  char *local_8;
  
  local_8 = data.value._8_8_;
  local_10 = data.value._0_8_;
  data_00 = (char *)((long)&local_10 + 4);
  if (0xc < data.value._0_4_) {
    data_00 = local_8;
  }
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringHeap::AddBlob(&this->heap,data_00,(ulong)data.value._0_4_);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

string_t AddBlob(string_t data) {
		return heap.AddBlob(data.GetData(), data.GetSize());
	}